

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void null_convert(j_compress_ptr cinfo,JSAMPARRAY input_buf,JSAMPIMAGE output_buf,
                 JDIMENSION output_row,int num_rows)

{
  int iVar1;
  uint uVar2;
  JSAMPROW pJVar3;
  JDIMENSION num_cols;
  int nc;
  int ci;
  JDIMENSION col;
  JSAMPROW outptr;
  JSAMPROW inptr;
  int num_rows_local;
  JDIMENSION output_row_local;
  JSAMPIMAGE output_buf_local;
  JSAMPARRAY input_buf_local;
  j_compress_ptr cinfo_local;
  
  iVar1 = cinfo->num_components;
  uVar2 = cinfo->image_width;
  inptr._0_4_ = num_rows;
  inptr._4_4_ = output_row;
  output_buf_local = (JSAMPIMAGE)input_buf;
  while (inptr._0_4_ = (int)inptr + -1, -1 < (int)inptr) {
    for (num_cols = 0; (int)num_cols < iVar1; num_cols = num_cols + 1) {
      outptr = (JSAMPROW)*output_buf_local;
      pJVar3 = output_buf[(int)num_cols][inptr._4_4_];
      for (nc = 0; (uint)nc < uVar2; nc = nc + 1) {
        pJVar3[(uint)nc] = outptr[(int)num_cols];
        outptr = outptr + iVar1;
      }
    }
    output_buf_local = output_buf_local + 1;
    inptr._4_4_ = inptr._4_4_ + 1;
  }
  return;
}

Assistant:

METHODDEF(void)
null_convert (j_compress_ptr cinfo,
	      JSAMPARRAY input_buf, JSAMPIMAGE output_buf,
	      JDIMENSION output_row, int num_rows)
{
  register JSAMPROW inptr;
  register JSAMPROW outptr;
  register JDIMENSION col;
  register int ci;
  int nc = cinfo->num_components;
  JDIMENSION num_cols = cinfo->image_width;

  while (--num_rows >= 0) {
    /* It seems fastest to make a separate pass for each component. */
    for (ci = 0; ci < nc; ci++) {
      inptr = *input_buf;
      outptr = output_buf[ci][output_row];
      for (col = 0; col < num_cols; col++) {
	outptr[col] = inptr[ci]; /* don't need GETJSAMPLE() here */
	inptr += nc;
      }
    }
    input_buf++;
    output_row++;
  }
}